

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool Fossilize::Hashing::compute_hash_raytracing_pipeline
               (StateRecorder *recorder,VkRayTracingPipelineCreateInfoKHR *create_info,
               Hash *out_hash)

{
  VkRayTracingPipelineInterfaceCreateInfoKHR *pVVar1;
  VkPipelineDynamicStateCreateInfo *pVVar2;
  VkRayTracingShaderGroupCreateInfoKHR *pVVar3;
  bool bVar4;
  bool bVar5;
  int *piVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  Hash hash;
  Hasher local_48;
  ulong local_40;
  ulong *local_38;
  
  for (piVar6 = (int *)create_info->pNext; piVar6 != (int *)0x0; piVar6 = *(int **)(piVar6 + 2)) {
    if (*piVar6 == 0x3ba1f5f5) goto LAB_0011e5b7;
  }
  piVar6 = (int *)0x0;
LAB_0011e5b7:
  uVar7 = (ulong)(create_info->flags & 0x7ffffc3f) ^ 0xaf63bd4c8601b7df;
  if (piVar6 != (int *)0x0) {
    uVar7 = 0xaf63bd4c8601b7df;
  }
  local_48.h = uVar7 * 0x100000001b3 ^ (ulong)create_info->maxPipelineRayRecursionDepth;
  bVar4 = StateRecorder::get_hash_for_pipeline_layout(recorder,create_info->layout,&local_40);
  if (bVar4) {
    local_48.h = (local_40 & 0xffffffff ^ local_48.h * 0x100000001b3) * 0x100000001b3 ^
                 local_40 >> 0x20;
    if (((create_info->flags & 4) == 0) || (create_info->basePipelineHandle == (VkPipeline)0x0)) {
      uVar7 = local_48.h * 0x100000001b3;
    }
    else {
      bVar4 = StateRecorder::get_hash_for_raytracing_pipeline_handle
                        (recorder,create_info->basePipelineHandle,&local_40);
      if (!bVar4) goto LAB_0011e87f;
      uVar7 = ((local_40 & 0xffffffff ^ local_48.h * 0x100000001b3) * 0x100000001b3 ^
              local_40 >> 0x20) * 0x100000001b3 ^ (ulong)(uint)create_info->basePipelineIndex;
    }
    local_48.h = uVar7 * 0x100000001b3 ^ (ulong)create_info->stageCount;
    local_38 = out_hash;
    if ((ulong)create_info->stageCount != 0) {
      lVar8 = 0;
      uVar7 = 0;
      do {
        bVar4 = compute_hash_stage(recorder,&local_48,
                                   (VkPipelineShaderStageCreateInfo *)
                                   ((long)&create_info->pStages->sType + lVar8));
        if (!bVar4) goto LAB_0011e87f;
        uVar7 = uVar7 + 1;
        lVar8 = lVar8 + 0x30;
      } while (uVar7 < create_info->stageCount);
    }
    pVVar1 = create_info->pLibraryInterface;
    if (pVVar1 == (VkRayTracingPipelineInterfaceCreateInfoKHR *)0x0) {
      local_48.h = local_48.h * 0x100000001b3;
    }
    else {
      local_48.h = (local_48.h * 0x100000001b3 ^ (ulong)pVVar1->maxPipelineRayHitAttributeSize) *
                   0x100000001b3 ^ (ulong)pVVar1->maxPipelineRayPayloadSize;
      bVar4 = hash_pnext_chain(recorder,&local_48,pVVar1->pNext,(DynamicStateInfo *)0x0,0);
      if (!bVar4) {
        return false;
      }
    }
    pVVar2 = create_info->pDynamicState;
    if (pVVar2 == (VkPipelineDynamicStateCreateInfo *)0x0) {
      local_48.h = local_48.h * 0x100000001b3;
    }
    else {
      uVar7 = (ulong)pVVar2->dynamicStateCount;
      local_48.h = (local_48.h * 0x100000001b3 ^ uVar7) * 0x100000001b3 ^ (ulong)pVVar2->flags;
      if (uVar7 != 0) {
        uVar9 = 0;
        do {
          local_48.h = local_48.h * 0x100000001b3 ^ (ulong)pVVar2->pDynamicStates[uVar9];
          uVar9 = uVar9 + 1;
        } while (uVar7 != uVar9);
      }
      bVar4 = hash_pnext_chain(recorder,&local_48,pVVar2->pNext,(DynamicStateInfo *)0x0,0);
      if (!bVar4) {
        return false;
      }
    }
    local_48.h = local_48.h * 0x100000001b3 ^ (ulong)create_info->groupCount;
    if ((ulong)create_info->groupCount != 0) {
      lVar8 = 0x20;
      uVar7 = 0;
      do {
        pVVar3 = create_info->pGroups;
        local_48.h = ((((local_48.h * 0x100000001b3 ^ (ulong)*(uint *)((long)pVVar3 + lVar8 + -0x10)
                        ) * 0x100000001b3 ^ (ulong)*(uint *)((long)pVVar3 + lVar8 + -4)) *
                       0x100000001b3 ^ (ulong)*(uint *)((long)pVVar3 + lVar8 + -8)) * 0x100000001b3
                     ^ (ulong)*(uint *)((long)pVVar3 + lVar8 + -0xc)) * 0x100000001b3 ^
                     (ulong)*(uint *)((long)&pVVar3->sType + lVar8);
        bVar4 = hash_pnext_chain(recorder,&local_48,*(void **)((long)pVVar3 + lVar8 + -0x18),
                                 (DynamicStateInfo *)0x0,0);
        if (!bVar4) {
          return false;
        }
        uVar7 = uVar7 + 1;
        lVar8 = lVar8 + 0x30;
      } while (uVar7 < create_info->groupCount);
    }
    if (create_info->pLibraryInfo == (VkPipelineLibraryCreateInfoKHR *)0x0) {
      local_48.h = local_48.h * 0x100000001b3;
    }
    else {
      bVar4 = hash_pnext_struct(recorder,&local_48,create_info->pLibraryInfo);
      if (!bVar4) goto LAB_0011e87f;
      bVar4 = hash_pnext_chain(recorder,&local_48,create_info->pLibraryInfo->pNext,
                               (DynamicStateInfo *)0x0,0);
      if (!bVar4) {
        return false;
      }
    }
    bVar4 = false;
    bVar5 = hash_pnext_chain(recorder,&local_48,create_info->pNext,(DynamicStateInfo *)0x0,0);
    if (bVar5) {
      *local_38 = local_48.h;
      bVar4 = true;
    }
  }
  else {
LAB_0011e87f:
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool compute_hash_raytracing_pipeline(const StateRecorder &recorder,
                                      const VkRayTracingPipelineCreateInfoKHR &create_info,
                                      Hash *out_hash)
{
	Hasher h;
	Hash hash;

	if (find_pnext<VkPipelineCreateFlags2CreateInfoKHR>(VK_STRUCTURE_TYPE_PIPELINE_CREATE_FLAGS_2_CREATE_INFO_KHR, create_info.pNext))
		h.u32(0);
	else
		h.u32(normalize_pipeline_creation_flags(create_info.flags));

	h.u32(create_info.maxPipelineRayRecursionDepth);

	if (!recorder.get_hash_for_pipeline_layout(create_info.layout, &hash))
		return false;
	h.u64(hash);

	if ((create_info.flags & VK_PIPELINE_CREATE_DERIVATIVE_BIT) != 0 &&
	    create_info.basePipelineHandle != VK_NULL_HANDLE)
	{
		if (!recorder.get_hash_for_raytracing_pipeline_handle(create_info.basePipelineHandle, &hash))
			return false;
		h.u64(hash);
		h.s32(create_info.basePipelineIndex);
	}
	else
		h.u32(0);

	h.u32(create_info.stageCount);
	for (uint32_t i = 0; i < create_info.stageCount; i++)
	{
		auto &stage = create_info.pStages[i];
		if (!compute_hash_stage(recorder, h, stage))
			return false;
	}

	if (create_info.pLibraryInterface)
	{
		h.u32(create_info.pLibraryInterface->maxPipelineRayHitAttributeSize);
		h.u32(create_info.pLibraryInterface->maxPipelineRayPayloadSize);
		if (!hash_pnext_chain(&recorder, h, create_info.pLibraryInterface->pNext, nullptr, 0))
			return false;
	}
	else
		h.u32(0);

	if (create_info.pDynamicState)
	{
		h.u32(create_info.pDynamicState->dynamicStateCount);
		h.u32(create_info.pDynamicState->flags);
		for (uint32_t i = 0; i < create_info.pDynamicState->dynamicStateCount; i++)
			h.u32(create_info.pDynamicState->pDynamicStates[i]);
		if (!hash_pnext_chain(&recorder, h, create_info.pDynamicState->pNext, nullptr, 0))
			return false;
	}
	else
		h.u32(0);

	h.u32(create_info.groupCount);
	for (uint32_t i = 0; i < create_info.groupCount; i++)
	{
		auto &group = create_info.pGroups[i];
		h.u32(group.type);
		h.u32(group.anyHitShader);
		h.u32(group.closestHitShader);
		h.u32(group.generalShader);
		h.u32(group.intersectionShader);
		if (!hash_pnext_chain(&recorder, h, group.pNext, nullptr, 0))
			return false;
	}

	if (create_info.pLibraryInfo)
	{
		if (!hash_pnext_struct(&recorder, h, *create_info.pLibraryInfo))
			return false;
		if (!hash_pnext_chain(&recorder, h, create_info.pLibraryInfo->pNext, nullptr, 0))
			return false;
	}
	else
		h.u32(0);

	if (!hash_pnext_chain(&recorder, h, create_info.pNext, nullptr, 0))
		return false;

	*out_hash = h.get();
	return true;
}